

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O2

void __thiscall MyJXSDescriptor::FillDescriptor(MyJXSDescriptor *this,MXFReader *Reader)

{
  MDD_t MVar1;
  undefined8 *puVar2;
  CDCIEssenceDescriptor *pCVar3;
  RGBAEssenceDescriptor *pRVar4;
  JPEGXSPictureSubDescriptor *pJVar5;
  ILogSink *pIVar6;
  long *plVar7;
  undefined8 uVar8;
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_> ObjectList
  ;
  Result_t local_90 [104];
  
  MVar1 = ASDCP::DefaultCompositeDict();
  puVar2 = (undefined8 *)ASDCP::Dictionary::Type(MVar1);
  ObjectList.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev._0_1_ = 1;
  ObjectList.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev._1_7_ = (undefined7)*puVar2;
  ObjectList.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node._M_size._0_1_ = (undefined1)((ulong)*puVar2 >> 0x38);
  ObjectList.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node._M_size._1_7_ = (undefined7)puVar2[1];
  ObjectList.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&PTR__IArchive_00115ae8;
  pCVar3 = get_descriptor_by_type<AS_02::JXS::MXFReader,ASDCP::MXF::CDCIEssenceDescriptor>
                     (Reader,(UL *)&ObjectList);
  this->m_CDCIDescriptor = pCVar3;
  MVar1 = ASDCP::DefaultCompositeDict();
  puVar2 = (undefined8 *)ASDCP::Dictionary::Type(MVar1);
  ObjectList.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev._0_1_ = 1;
  ObjectList.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev._1_7_ = (undefined7)*puVar2;
  ObjectList.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node._M_size._0_1_ = (undefined1)((ulong)*puVar2 >> 0x38);
  ObjectList.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node._M_size._1_7_ = (undefined7)puVar2[1];
  ObjectList.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&PTR__IArchive_00115ae8;
  pRVar4 = get_descriptor_by_type<AS_02::JXS::MXFReader,ASDCP::MXF::RGBAEssenceDescriptor>
                     (Reader,(UL *)&ObjectList);
  this->m_RGBADescriptor = pRVar4;
  if ((pRVar4 == (RGBAEssenceDescriptor *)0x0) &&
     (pRVar4 = (RGBAEssenceDescriptor *)this->m_CDCIDescriptor,
     pRVar4 == (RGBAEssenceDescriptor *)0x0)) {
    pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar6,"Picture descriptor not found.\n");
  }
  else {
    (this->m_SampleRate).super_Rational = *(Rational *)(pRVar4 + 0xf0);
    if (pRVar4[0x100] == (RGBAEssenceDescriptor)0x1) {
      this->ContainerDuration = *(ui64_t *)(pRVar4 + 0xf8);
    }
  }
  MVar1 = ASDCP::DefaultCompositeDict();
  puVar2 = (undefined8 *)ASDCP::Dictionary::Type(MVar1);
  ObjectList.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev._0_1_ = 1;
  ObjectList.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev._1_7_ = (undefined7)*puVar2;
  ObjectList.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node._M_size._0_1_ = (undefined1)((ulong)*puVar2 >> 0x38);
  ObjectList.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node._M_size._1_7_ = (undefined7)puVar2[1];
  ObjectList.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&PTR__IArchive_00115ae8;
  pJVar5 = get_descriptor_by_type<AS_02::JXS::MXFReader,ASDCP::MXF::JPEGXSPictureSubDescriptor>
                     (Reader,(UL *)&ObjectList);
  this->m_JPEGXSSubDescriptor = pJVar5;
  if (pJVar5 == (JPEGXSPictureSubDescriptor *)0x0) {
    pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar6,"JPEGXSPictureSubDescriptor not found.\n");
  }
  ObjectList.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev._0_1_ = SUB81((_List_node_base *)&ObjectList,0);
  ObjectList.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev._1_7_ = (undefined7)((ulong)&ObjectList >> 8);
  ObjectList.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node._M_size._0_1_ = 0;
  ObjectList.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node._M_size._1_7_ = 0;
  ObjectList.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ObjectList;
  plVar7 = (long *)(**(code **)(*(long *)Reader + 0x10))(Reader);
  MVar1 = ASDCP::DefaultCompositeDict();
  uVar8 = ASDCP::Dictionary::Type(MVar1);
  (**(code **)(*plVar7 + 0xb0))(local_90,plVar7,uVar8,(_List_node_base *)&ObjectList);
  Kumu::Result_t::~Result_t(local_90);
  if (ObjectList.
      super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
      ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&ObjectList) {
    pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar6,"MXF Metadata contains no Track Sets.\n");
  }
  (this->m_EditRate).super_Rational =
       (Rational)
       ObjectList.
       super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
       ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[0x10]._M_prev;
  std::__cxx11::
  _List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
  _M_clear(&ObjectList.
            super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
          );
  return;
}

Assistant:

void FillDescriptor(AS_02::JXS::MXFReader& Reader)
  {
    m_CDCIDescriptor = get_descriptor_by_type<AS_02::JXS::MXFReader, CDCIEssenceDescriptor>
      (Reader, DefaultCompositeDict().ul(MDD_CDCIEssenceDescriptor));

    m_RGBADescriptor = get_descriptor_by_type<AS_02::JXS::MXFReader, RGBAEssenceDescriptor>
      (Reader, DefaultCompositeDict().ul(MDD_RGBAEssenceDescriptor));

    if ( m_RGBADescriptor != 0 )
      {
    	m_SampleRate = m_RGBADescriptor->SampleRate;
        if ( ! m_RGBADescriptor->ContainerDuration.empty() )
          {
            ContainerDuration = m_RGBADescriptor->ContainerDuration;
          }
      }
    else if ( m_CDCIDescriptor != 0 )
      {
    	m_SampleRate = m_CDCIDescriptor->SampleRate;
        if ( ! m_CDCIDescriptor->ContainerDuration.empty() )
          {
            ContainerDuration = m_CDCIDescriptor->ContainerDuration;
          }
      }
    else
      {
	DefaultLogSink().Error("Picture descriptor not found.\n");
      }

    m_JPEGXSSubDescriptor = get_descriptor_by_type<AS_02::JXS::MXFReader, JPEGXSPictureSubDescriptor>
      (Reader, DefaultCompositeDict().ul(MDD_JPEGXSPictureSubDescriptor));

    if ( m_JPEGXSSubDescriptor == 0 )
      {
	DefaultLogSink().Error("JPEGXSPictureSubDescriptor not found.\n");
      }

    std::list<InterchangeObject*> ObjectList;
    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_Track), ObjectList);
    
    if ( ObjectList.empty() )
      {
	DefaultLogSink().Error("MXF Metadata contains no Track Sets.\n");
      }

    m_EditRate = ((Track*)ObjectList.front())->EditRate;
  }